

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O2

shared_ptr<const_rcg::Image> __thiscall
rcg::ImageList::find(ImageList *this,uint64_t timestamp,uint64_t tolerance)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  shared_ptr<const_rcg::Image> sVar9;
  
  plVar1 = *(long **)(timestamp + 8);
  lVar4 = *(long *)(timestamp + 0x10) - (long)plVar1;
  if (lVar4 != 0) {
    if (in_RCX == 0) {
      sVar9 = find(this,timestamp);
      tolerance = (uint64_t)
                  sVar9.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
      goto LAB_0011a6ab;
    }
    uVar7 = *(ulong *)(*plVar1 + 8);
    uVar3 = uVar7 - tolerance;
    if (uVar7 < tolerance) {
      uVar3 = -(uVar7 - tolerance);
    }
    uVar5 = 0;
    plVar6 = plVar1;
    for (uVar7 = 1; plVar6 = plVar6 + 2, uVar7 < (ulong)(lVar4 >> 4); uVar7 = uVar7 + 1) {
      uVar2 = *(ulong *)(*plVar6 + 8);
      uVar8 = uVar2 - tolerance;
      if (uVar2 < tolerance) {
        uVar8 = -(uVar2 - tolerance);
      }
      if (uVar8 < uVar3) {
        uVar5 = uVar7;
        uVar3 = uVar8;
      }
    }
    if (uVar3 < in_RCX) {
      std::__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)(plVar1 + uVar5 * 2))
      ;
      tolerance = (uint64_t)extraout_RDX;
      goto LAB_0011a6ab;
    }
  }
  this->maxsize = 0;
  (this->list).
  super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0011a6ab:
  sVar9.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tolerance;
  sVar9.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_rcg::Image>)
         sVar9.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Image> ImageList::find(uint64_t timestamp, uint64_t tolerance) const
{
  if (list.size() > 0)
  {
    if (tolerance > 0)
    {
      size_t min_i=0;
      uint64_t min_ad=absDiff(list[0]->getTimestampNS(), timestamp);

      for (size_t i=1; i<list.size(); i++)
      {
        uint64_t ad=absDiff(list[i]->getTimestampNS(), timestamp);

        if (ad < min_ad)
        {
          min_i=i;
          min_ad=ad;
        }
      }

      if (min_ad < tolerance)
      {
        return list[min_i];
      }
    }
    else
    {
      return find(timestamp);
    }
  }

  return std::shared_ptr<const Image>();
}